

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadDeviceTest<vkt::api::(anonymous_namespace)::BufferView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  deUint32 maxResourceConsumers_;
  EnvClone *pEVar1;
  reference pvVar2;
  Resources *pRVar3;
  reference pvVar4;
  CreateThread<vkt::api::(anonymous_namespace)::BufferView> *this;
  DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread> local_119;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_118;
  SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources> local_108;
  SharedPtr<vkt::api::(anonymous_namespace)::EnvClone> local_f8;
  uint local_e4;
  undefined1 local_e0 [4];
  deUint32 ndx;
  ThreadGroup threads;
  undefined1 local_a8 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
  resources;
  allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_> local_79;
  undefined1 local_78 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  perThreadEnv;
  Environment sharedEnv;
  Parameters deviceParams;
  deUint32 numThreads;
  Context *context_local;
  
  maxResourceConsumers_ = getDefaultTestThreadCount();
  register0x00000000 = getDefaulDeviceParameters(context);
  Environment::Environment
            ((Environment *)
             &perThreadEnv.
              super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,context,maxResourceConsumers_);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>::allocator(&local_79);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
            *)local_78,(ulong)maxResourceConsumers_,&local_79);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>::~allocator(&local_79);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>::allocator
            ((allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_> *)
             &threads.field_0x2f);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
            *)local_a8,(ulong)maxResourceConsumers_,(allocator_type *)&threads.field_0x2f);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>::~allocator
            ((allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_> *)
             &threads.field_0x2f);
  ThreadGroup::ThreadGroup((ThreadGroup *)local_e0);
  for (local_e4 = 0; local_e4 < maxResourceConsumers_; local_e4 = local_e4 + 1) {
    pEVar1 = (EnvClone *)operator_new(0x6c0);
    EnvClone::EnvClone(pEVar1,(Environment *)
                              &perThreadEnv.
                               super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (Parameters *)&sharedEnv.field_0x34,1);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::SharedPtr(&local_f8,pEVar1);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_78,(ulong)local_e4);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator=(pvVar2,&local_f8);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::~SharedPtr(&local_f8);
    pRVar3 = (Resources *)operator_new(0x50);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_78,(ulong)local_e4);
    pEVar1 = de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator->(pvVar2);
    BufferView::Resources::Resources(pRVar3,&pEVar1->env,&params);
    de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>::SharedPtr
              (&local_108,pRVar3);
    pvVar4 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
                           *)local_a8,(ulong)local_e4);
    de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>::operator=
              (pvVar4,&local_108);
    de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>::~SharedPtr(&local_108);
    this = (CreateThread<vkt::api::(anonymous_namespace)::BufferView> *)operator_new(0x88);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_78,(ulong)local_e4);
    pEVar1 = de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator->(pvVar2);
    pvVar4 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
                           *)local_a8,(ulong)local_e4);
    pRVar3 = de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>::operator*
                       (pvVar4);
    CreateThread<vkt::api::(anonymous_namespace)::BufferView>::CreateThread
              (this,&pEVar1->env,pRVar3,&params);
    de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>::DefaultDeleter
              (&local_119);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_118,this);
    ThreadGroup::add((ThreadGroup *)local_e0,&local_118);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_118);
  }
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_e0);
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_e0);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::BufferView::Resources>_>_>
             *)local_a8);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             *)local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadDeviceTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<EnvClone>						EnvPtr;
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32				numThreads		= getDefaultTestThreadCount();
	const Device::Parameters	deviceParams	= getDefaulDeviceParameters(context);
	const Environment			sharedEnv		(context, numThreads);			// For creating Device's
	vector<EnvPtr>				perThreadEnv	(numThreads);
	vector<ResPtr>				resources		(numThreads);
	ThreadGroup					threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		perThreadEnv[ndx]	= EnvPtr(new EnvClone(sharedEnv, deviceParams, 1u));
		resources[ndx]		= ResPtr(new typename Object::Resources(perThreadEnv[ndx]->env, params));

		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(perThreadEnv[ndx]->env, *resources[ndx], params)));
	}

	return threads.run();
}